

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void Range_Normalize(CPpmd7z_RangeDec *p)

{
  UInt32 UVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = p->Range;
  uVar3 = p->Low;
  do {
    if (0xffffff < (uVar4 + uVar3 ^ uVar3)) {
      if (p->Bottom <= uVar4) {
        return;
      }
      p->Range = p->Bottom - 1 & -uVar3;
    }
    UVar1 = p->Code;
    bVar2 = (*p->Stream->Read)(p->Stream);
    p->Code = (uint)bVar2 | UVar1 << 8;
    uVar4 = p->Range << 8;
    p->Range = uVar4;
    uVar3 = p->Low << 8;
    p->Low = uVar3;
  } while( true );
}

Assistant:

static void Range_Normalize(CPpmd7z_RangeDec *p)
{
  while (1)
  {
    if((p->Low ^ (p->Low + p->Range)) >= kTopValue)
    {
      if(p->Range >= p->Bottom)
        break;
      else
        p->Range = ((uint32_t)(-(int32_t)p->Low)) & (p->Bottom - 1);
    }
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}